

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

fdb_status
filemgr_copy_file_range
          (filemgr *src_file,filemgr *dst_file,bid_t src_bid,bid_t dst_bid,bid_t clone_len)

{
  fdb_status fVar1;
  ulong uVar2;
  
  uVar2 = (ulong)src_file->blocksize;
  fVar1 = (*dst_file->ops->copy_file_range)
                    (src_file->fs_type,src_file->fd,dst_file->fd,src_bid * uVar2,uVar2 * dst_bid,
                     uVar2 * clone_len);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    LOCK();
    (dst_file->pos).super___atomic_base<unsigned_long>._M_i = (clone_len + dst_bid) * uVar2;
    UNLOCK();
  }
  return fVar1;
}

Assistant:

fdb_status filemgr_copy_file_range(struct filemgr *src_file,
                                   struct filemgr *dst_file,
                                   bid_t src_bid, bid_t dst_bid,
                                   bid_t clone_len)
{
    uint32_t blocksize = src_file->blocksize;
    fdb_status fs = (fdb_status)dst_file->ops->copy_file_range(
                                            src_file->fs_type,
                                            src_file->fd,
                                            dst_file->fd,
                                            src_bid * blocksize,
                                            dst_bid * blocksize,
                                            clone_len * blocksize);
    if (fs != FDB_RESULT_SUCCESS) {
        return fs;
    }
    atomic_store_uint64_t(&dst_file->pos, (dst_bid + clone_len) * blocksize);
    return FDB_RESULT_SUCCESS;
}